

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_parse_short_option(nn_parse_context *ctx)

{
  int iVar1;
  nn_option *opt_00;
  nn_option *opt;
  int i;
  nn_parse_context *ctx_local;
  
  opt._4_4_ = 0;
  while( true ) {
    opt_00 = ctx->options + opt._4_4_;
    if (opt_00->longname == (char *)0x0) {
      nn_error_unknown_short_option(ctx);
      return;
    }
    if ((opt_00->shortname != '\0') && (opt_00->shortname == *ctx->data)) break;
    opt._4_4_ = opt._4_4_ + 1;
  }
  ctx->last_option_usage[opt._4_4_] = ctx->data;
  iVar1 = nn_has_arg(opt_00);
  if (iVar1 != 0) {
    if (ctx->data[1] == '\0') {
      iVar1 = nn_get_arg(ctx);
      if (iVar1 == 0) {
        nn_option_error("requires an argument",ctx,opt._4_4_);
      }
      else {
        nn_process_option(ctx,opt._4_4_,ctx->data);
      }
    }
    else {
      nn_process_option(ctx,opt._4_4_,ctx->data + 1);
    }
    ctx->data = "";
    return;
  }
  nn_process_option(ctx,opt._4_4_,(char *)0x0);
  ctx->data = ctx->data + 1;
  return;
}

Assistant:

static void nn_parse_short_option (struct nn_parse_context *ctx)
{
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!opt->shortname)
            continue;
        if (opt->shortname == *ctx->data) {
            ctx->last_option_usage[i] = ctx->data;
            if (nn_has_arg (opt)) {
                if (ctx->data[1]) {
                    nn_process_option (ctx, i, ctx->data+1);
                } else {
                    if (nn_get_arg (ctx)) {
                        nn_process_option (ctx, i, ctx->data);
                    } else {
                        nn_option_error ("requires an argument", ctx, i);
                    }
                }
                ctx->data = "";  /* end of short options anyway */
            } else {
                nn_process_option (ctx, i, NULL);
                ctx->data += 1;
            }
            return;
        }
    }
    nn_error_unknown_short_option (ctx);
}